

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_curve.cpp
# Opt level: O1

bool __thiscall
ON_Curve::EvTangent(ON_Curve *this,double t,ON_3dPoint *point,ON_3dVector *tangent,int side,
                   int *hint)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  double *pdVar4;
  int iVar5;
  int iVar6;
  double dVar7;
  double dVar8;
  ON_Interval domain;
  double tplus;
  double tminus;
  ON_3dVector D2;
  ON_3dVector d1;
  ON_3dVector d2;
  ON_3dPoint p;
  ON_3dVector D1;
  ON_Interval local_e0;
  double local_d0;
  double local_c8;
  ON_3dVector local_c0;
  ON_3dVector local_a8;
  ON_3dVector local_90;
  ON_3dVector local_78;
  ON_3dPoint local_60;
  ON_3dVector local_48;
  
  tangent->z = ON_3dVector::ZeroVector.z;
  dVar7 = ON_3dVector::ZeroVector.y;
  dVar8 = ON_3dVector::ZeroVector.x;
  tangent->x = ON_3dVector::ZeroVector.x;
  tangent->y = dVar7;
  bVar1 = Ev1Der(this,t,point,tangent,side,hint);
  if (!bVar1) {
    return bVar1;
  }
  bVar2 = ON_3dVector::Unitize(tangent);
  if (bVar2) {
    return bVar1;
  }
  bVar2 = Ev2Der(this,t,point,&local_48,&local_c0,side,hint);
  if (!bVar2) {
    return bVar1;
  }
  tangent->z = local_c0.z;
  tangent->x = local_c0.x;
  tangent->y = local_c0.y;
  bVar1 = ON_3dVector::Unitize(tangent);
  if (!bVar1) {
    return bVar1;
  }
  (*(this->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x25])(this);
  local_c8 = 0.0;
  local_d0 = 0.0;
  local_e0.m_t[1] = dVar8;
  bVar2 = ON_Interval::IsIncreasing(&local_e0);
  if (!bVar2) {
    return bVar1;
  }
  iVar3 = (*(this->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x2d])
                    (t,this,&local_c8,&local_d0);
  if ((char)iVar3 == '\0') {
    return bVar1;
  }
  pdVar4 = ON_Interval::operator[](&local_e0,1);
  if ((side < 0) || (*pdVar4 <= t)) {
    pdVar4 = ON_Interval::operator[](&local_e0,0);
    if ((*pdVar4 != t) || (NAN(*pdVar4) || NAN(t))) {
      pdVar4 = ON_Interval::operator[](&local_e0,0);
      if ((-1 < side) || (t < *pdVar4 || t == *pdVar4)) {
        pdVar4 = ON_Interval::operator[](&local_e0,1);
        if ((*pdVar4 != t) || (NAN(*pdVar4) || NAN(t))) {
          dVar8 = 0.0;
          goto LAB_0042a0c5;
        }
      }
      dVar8 = local_c8 - t;
      if (0.0 <= dVar8) {
        return true;
      }
      dVar7 = ON_Interval::ParameterAt(&local_e0,0.9);
      if (dVar8 + t < dVar7) {
        return true;
      }
      goto LAB_0042a0c5;
    }
  }
  dVar8 = local_d0 - t;
  if ((dVar8 <= 0.0) || (dVar7 = ON_Interval::ParameterAt(&local_e0,0.1), dVar7 < dVar8 + t)) {
    return true;
  }
LAB_0042a0c5:
  iVar3 = 0;
  iVar5 = 3;
  iVar6 = 0;
  do {
    dVar7 = dVar8 + t;
    if ((((dVar7 == t) && (!NAN(dVar7) && !NAN(t))) ||
        (bVar2 = Ev2Der(this,dVar7,&local_60,&local_a8,&local_78,side,(int *)0x0), !bVar2)) ||
       (dVar7 = ON_3dVector::operator*(&local_a8,&local_78), 0.0 < dVar7)) break;
    iVar6 = iVar6 + (uint)(dVar7 < 0.0);
    iVar3 = iVar3 + (uint)(0.0 <= dVar7);
    dVar8 = dVar8 * 0.5;
    iVar5 = iVar5 + -1;
  } while (iVar5 != 0);
  if (iVar6 == 0) {
    return bVar1;
  }
  if (iVar3 + iVar6 == 3) {
    ON_3dVector::operator-(&local_90,tangent);
    tangent->z = local_90.z;
    tangent->x = local_90.x;
    tangent->y = local_90.y;
    return bVar1;
  }
  return bVar1;
}

Assistant:

bool ON_Curve::EvTangent(
       double t,
       ON_3dPoint& point,
       ON_3dVector& tangent,
       int side,
       int* hint
       ) const
{
  ON_3dVector D1, D2;//, K;
  tangent = ON_3dVector::ZeroVector;
  int rc = Ev1Der( t, point, tangent, side, hint );
  if ( rc && !tangent.Unitize() ) 
  {
    if ( Ev2Der( t, point, D1, D2, side, hint ) )
    {
      // Use l'Hopital's rule to show that if the unit tangent
      // exists, the 1rst derivative is zero, and the 2nd
      // derivative is nonzero, then the unit tangent is equal
      // to +/-the unitized 2nd derivative.  The sign is equal
      // to the sign of D1(s) o D2(s) as s approaches the 
      // evaluation parameter.
      tangent = D2;
      rc = tangent.Unitize();
      if ( rc )
      {
        ON_Interval domain = Domain();
        double tminus = 0.0;
        double tplus = 0.0;
        if ( domain.IsIncreasing() && GetParameterTolerance( t, &tminus, &tplus ) )
        {
          ON_3dPoint p;
          ON_3dVector d1, d2;
          double eps = 0.0;
          double d1od2tol = 0.0; //1.0e-10; // 1e-5 is too big
          double d1od2;
          double tt = t;
          //double dt = 0.0;

          if ( (t < domain[1] && side >= 0) || (t == domain[0]) )
          {
            eps = tplus-t;
            if ( eps <= 0.0 || t+eps > domain.ParameterAt(0.1) )
              return rc;
          }
          else if ( (t > domain[0] && side < 0) || (t == domain[1]) )
          {
            eps = tminus - t;
            if ( eps >= 0.0 || t+eps < domain.ParameterAt(0.9) )
              return rc;
          }

          int i, negative_count=0, zero_count=0;
          int test_count = 3;
          for ( i = 0; i < test_count; i++, eps *= 0.5 )
          {
            tt = t + eps;
            if ( tt == t )
              break;
            if (!Ev2Der( tt, p, d1, d2, side, 0 ))
              break;
            d1od2 = d1*d2;
            if ( d1od2 > d1od2tol )
              break;
            if ( d1od2 < d1od2tol )
              negative_count++;
            else
              zero_count++;
          }
          if ( negative_count > 0 && test_count == negative_count+zero_count )
          {
            // all sampled d1od2 values were <= 0 
            // and at least one was strictly < 0.
            tangent = -tangent;
          }
        }
      }
    }
  }
  return rc;
}